

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall SocketPP::TCPServer::startSendThread(TCPServer *this)

{
  thread *ptVar1;
  pointer *__ptr;
  long *local_18;
  
  ptVar1 = (thread *)operator_new(8);
  (ptVar1->_M_id)._M_thread = 0;
  local_18 = (long *)operator_new(0x10);
  *local_18 = (long)&PTR___State_0010bd38;
  local_18[1] = (long)this;
  std::thread::_M_start_thread(ptVar1,&local_18,0);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  this->sendThread_ = ptVar1;
  return;
}

Assistant:

void TCPServer::startSendThread() {
    sendThread_ = new std::thread([this] {
        LOGD("sendThread running...");
        Message msg;

        while (true) {
            {
                std::unique_lock<std::mutex> lock(msgQueueMutex_);
                LOGD("msgQueue_.size=%ld, msgQueueCondition_ will %s", msgQueue_.size(),
                     msgQueue_.empty() ? "waiting..." : "not wait!");
                msgQueueCondition_.wait(lock, [this] { return !msgQueue_.empty() || stopped_; });
                LOGD("msgQueueCondition_ wake! msgQueue_.size=%ld", msgQueue_.size());

                if (stopped_) return;

                msg = msgQueue_.front();
                msgQueue_.pop();
            }

            send(msg);
        }
    });
}